

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndr.h
# Opt level: O2

void Ndr_AddObject(void *pDesign,int ModuleId,int ObjType,int InstName,int RangeLeft,int RangeRight,
                  int fSignedness,int nInputs,int *pInputs,int nOutputs,int *pOutputs,
                  char *pFunction)

{
  int i;
  int iVar1;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  
  i = *pDesign;
  Ndr_DataResize((Ndr_Data_t *)pDesign,6);
  *(undefined1 *)(*(long *)((long)pDesign + 8) + (long)*pDesign) = 3;
  iVar1 = *pDesign;
  *(int *)pDesign = iVar1 + 1;
  *(undefined4 *)(*(long *)((long)pDesign + 0x10) + (long)iVar1 * 4) = 0;
  *(undefined1 *)(*(long *)((long)pDesign + 8) + (long)*pDesign) = 6;
  iVar1 = *pDesign;
  *(int *)pDesign = iVar1 + 1;
  *(int *)(*(long *)((long)pDesign + 0x10) + (long)iVar1 * 4) = ObjType;
  Ndr_DataPushArray((Ndr_Data_t *)pDesign,4,InstName,(int *)CONCAT44(in_register_00000084,RangeLeft)
                   );
  Ndr_DataPushArray((Ndr_Data_t *)pDesign,5,1,(int *)CONCAT44(in_register_0000008c,RangeRight));
  Ndr_DataAddTo((Ndr_Data_t *)pDesign,i,*pDesign - i);
  Ndr_DataAddTo((Ndr_Data_t *)pDesign,ModuleId + -0x100,*pDesign - i);
  Ndr_DataAddTo((Ndr_Data_t *)pDesign,0,*pDesign - i);
  if (**(int **)((long)pDesign + 0x10) == *pDesign) {
    return;
  }
  __assert_fail("(int)p->pBody[0] == p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                ,0x239,
                "void Ndr_AddObject(void *, int, int, int, int, int, int, int, int *, int, int *, char *)"
               );
}

Assistant:

static inline void Ndr_AddObject( void * pDesign, int ModuleId,
                                  int ObjType, int InstName, 
                                  int RangeLeft, int RangeRight, int fSignedness, 
                                  int nInputs, int * pInputs, 
                                  int nOutputs, int * pOutputs, 
                                  char * pFunction )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pDesign;
    int Mod = ModuleId - 256;  
    int Obj = p->nSize;  assert( ObjType != 0 );
    Ndr_DataResize( p, 6 );
    Ndr_DataPush( p, NDR_OBJECT, 0 );
    Ndr_DataPush( p, NDR_OPERTYPE, ObjType );
    Ndr_DataPushRange( p, RangeLeft, RangeRight, fSignedness );
    if ( InstName )
        Ndr_DataPush( p, NDR_NAME, InstName );
    Ndr_DataPushArray( p, NDR_INPUT, nInputs, pInputs );
    Ndr_DataPushArray( p, NDR_OUTPUT, nOutputs, pOutputs );
    Ndr_DataPushString( p, ObjType, NDR_FUNCTION, pFunction );
    Ndr_DataAddTo( p, Obj, p->nSize - Obj );
    Ndr_DataAddTo( p, Mod, p->nSize - Obj );
    Ndr_DataAddTo( p, 0, p->nSize - Obj );
    assert( (int)p->pBody[0] == p->nSize );
}